

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O0

bool test::operator==(NsPerson *a,NsPerson *b)

{
  int *in_RSI;
  int *in_RDI;
  undefined1 local_11;
  
  local_11 = false;
  if (*in_RDI == *in_RSI) {
    local_11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               a,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)b);
  }
  return local_11;
}

Assistant:

bool operator==(const NsPerson& a, const NsPerson& b)
  {
    return a.age == b.age && a.name == b.name;
  }